

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymLocal::gen_code_setlcl(CTcSymLocal *this)

{
  int iVar1;
  CTcCodeStream **__n;
  void *__buf;
  void *__buf_00;
  long in_RDI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  CTcSymLocalBase *in_stack_ffffffffffffffe8;
  CTcCodeStream *this_00;
  
  if ((*(ushort *)(in_RDI + 100) >> 4 & 1) == 0) {
    gen_code_setlcl_stk((CTcSymLocal *)0x2d8876);
  }
  else if ((*(int *)(in_RDI + 0x40) < 0x100) &&
          (iVar1 = CTcSymLocalBase::get_ctx_arr_idx(in_stack_ffffffffffffffe8), iVar1 < 0x100)) {
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    __n = &G_cs;
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,(int)(char)*(undefined4 *)(in_RDI + 0x40),__buf,0x46b538);
    this_00 = G_cs;
    iVar1 = CTcSymLocalBase::get_ctx_arr_idx((CTcSymLocalBase *)G_cs);
    CTcDataStream::write(&this_00->super_CTcDataStream,(int)(char)iVar1,__buf_00,(size_t)__n);
    CTcGenTarg::note_pop((CTcGenTarg *)0x2d880b);
  }
  else {
    s_gen_code_getlcl(0,0x2d881c);
    CTcSymLocalBase::get_ctx_arr_idx(in_stack_ffffffffffffffe8);
    CTPNConst::s_gen_code_int(0x2d882e);
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcGenTarg::note_pop(G_cg,3);
  }
  return;
}

Assistant:

void CTcSymLocal::gen_code_setlcl()
{
    /* check to see if we're a context local (as opposed to a stack local) */
    if (is_ctx_local_)
    {
        /* generate the assignment using the appropriate sequence */
        if (ctx_var_num_ <= 255 && get_ctx_arr_idx() <= 255)
        {
            /* we can fit this in a single instruction */
            G_cg->write_op(OPC_SETINDLCL1I8);
            G_cs->write((uchar)ctx_var_num_);
            G_cs->write((uchar)get_ctx_arr_idx());

            /* this pops the value being assigned */
            G_cg->note_pop();
        }
        else
        {
            /* get our context array */
            s_gen_code_getlcl(ctx_var_num_, FALSE);
            
            /* set our value in the context array */
            CTPNConst::s_gen_code_int(get_ctx_arr_idx());
            G_cg->write_op(OPC_SETIND);
            G_cg->write_op(OPC_DISC);
            
            /* 
             *   the SETIND pops three values and pushes one (for a net two
             *   pops), and the DISC pops one more value, so our total is
             *   three pops 
             */
            G_cg->note_pop(3);
        }
    }
    else
    {
        /* we're just a plain stack variable */
        gen_code_setlcl_stk();
    }
}